

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_proxy.h
# Opt level: O0

sc_lv_base * __thiscall
sc_dt::sc_proxy<sc_dt::sc_lv_base>::assign_(sc_proxy<sc_dt::sc_lv_base> *this,sc_unsigned *a)

{
  sc_lv_base *psVar1;
  sc_proxy<sc_dt::sc_lv_base> *in_RDI;
  
  assign_v_<sc_dt::sc_lv_base>(this,a);
  psVar1 = back_cast(in_RDI);
  return psVar1;
}

Assistant:

X& assign_( const sc_unsigned& a )
	{ assign_v_( *this, a ); return back_cast(); }